

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_trans_warp_magnifier.cpp
# Opt level: O3

void __thiscall
agg::trans_warp_magnifier::inverse_transform(trans_warp_magnifier *this,double *x,double *y)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar1 = *(double *)this;
  dVar4 = *(double *)(this + 0x10);
  dVar2 = *y - *(double *)(this + 8);
  dVar3 = *x - dVar1;
  dVar5 = SQRT(dVar3 * dVar3 + dVar2 * dVar2);
  if (*(double *)(this + 0x18) * dVar4 <= dVar5) {
    dVar4 = dVar5 - *(double *)(this + 0x18) * (dVar4 + -1.0);
    *x = (dVar3 * dVar4) / dVar5 + dVar1;
    dVar2 = (dVar2 * dVar4) / dVar5;
  }
  else {
    *x = dVar3 / dVar4 + dVar1;
    dVar2 = dVar2 / *(double *)(this + 0x10);
  }
  *y = dVar2 + *(double *)(this + 8);
  return;
}

Assistant:

void trans_warp_magnifier::inverse_transform(double* x, double* y) const
    {
        // New version by Andrew Skalkin
        //-----------------
        double dx = *x - m_xc;
        double dy = *y - m_yc;
        double r = sqrt(dx * dx + dy * dy);

        if(r < m_radius * m_magn) 
        {
            *x = m_xc + dx / m_magn;
            *y = m_yc + dy / m_magn;
        }
        else
        {
            double rnew = r - m_radius * (m_magn - 1.0);
            *x = m_xc + rnew * dx / r; 
            *y = m_yc + rnew * dy / r;
        }

        // Old version
        //-----------------
        //trans_warp_magnifier t(*this);
        //t.magnification(1.0 / m_magn);
        //t.radius(m_radius * m_magn);
        //t.transform(x, y);
    }